

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::paintEvent(QTreeView *this,QPaintEvent *event)

{
  bool bVar1;
  QTreeViewPrivate *this_00;
  AnimatedOperation *this_01;
  QRegion *pQVar2;
  QAbstractItemViewPrivate *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QPainter *unaff_retaddr;
  QTreeViewPrivate *in_stack_00000008;
  QTreeViewPrivate *d;
  QPainter painter;
  QRegion *in_stack_00000060;
  QPainter *in_stack_00000068;
  QTreeView *in_stack_00000070;
  QPaintDevice *local_50;
  QRect local_30;
  QRegion local_20;
  QRegion local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8f485f);
  QAbstractItemViewPrivate::executePostedLayout(in_RDI);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (AnimatedOperation *)QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI);
  local_50 = (QPaintDevice *)0x0;
  if (this_01 != (AnimatedOperation *)0x0) {
    local_50 = (QPaintDevice *)&this_01->item;
  }
  QPainter::QPainter((QPainter *)&local_10,local_50);
  bVar1 = QAbstractItemViewPrivate::isAnimating(&this_00->super_QAbstractItemViewPrivate);
  if (bVar1) {
    pQVar2 = QPaintEvent::region((QPaintEvent *)in_RSI);
    local_30 = QTreeViewPrivate::AnimatedOperation::rect(this_01);
    QRegion::QRegion(&local_20,(QRect *)&local_30,Rectangle);
    QRegion::operator-(&local_18,(QRegion *)pQVar2);
    drawTree(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    QRegion::~QRegion(&local_18);
    QRegion::~QRegion(&local_20);
    QTreeViewPrivate::drawAnimatedOperation(in_stack_00000008,unaff_retaddr);
  }
  else {
    QPaintEvent::region((QPaintEvent *)in_RSI);
    drawTree(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    QAbstractItemViewPrivate::paintDropIndicator(in_RSI,(QPainter *)this_00);
  }
  QPainter::~QPainter((QPainter *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::paintEvent(QPaintEvent *event)
{
    Q_D(QTreeView);
    d->executePostedLayout();
    QPainter painter(viewport());
#if QT_CONFIG(animation)
    if (d->isAnimating()) {
        drawTree(&painter, event->region() - d->animatedOperation.rect());
        d->drawAnimatedOperation(&painter);
    } else
#endif // animation
    {
        drawTree(&painter, event->region());
#if QT_CONFIG(draganddrop)
        d->paintDropIndicator(&painter);
#endif
    }
}